

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

void ZSTD_ldm_skipSequences(rawSeqStore_t *rawSeqStore,size_t srcSize,U32 minMatch)

{
  ulong uVar1;
  ulong uVar2;
  rawSeq *prVar3;
  uint uVar4;
  ulong uVar5;
  
  while( true ) {
    if (srcSize == 0) {
      return;
    }
    uVar1 = rawSeqStore->pos;
    uVar2 = rawSeqStore->size;
    if (uVar2 <= uVar1) {
      return;
    }
    prVar3 = rawSeqStore->seq;
    uVar4 = prVar3[uVar1].litLength;
    uVar5 = srcSize - uVar4;
    if (srcSize < uVar4 || uVar5 == 0) {
      prVar3[uVar1].litLength = uVar4 - (int)srcSize;
      return;
    }
    prVar3[uVar1].litLength = 0;
    uVar4 = prVar3[uVar1].matchLength;
    srcSize = uVar5 - uVar4;
    if (uVar5 < uVar4) break;
    prVar3[uVar1].matchLength = 0;
    rawSeqStore->pos = uVar1 + 1;
  }
  uVar4 = uVar4 - (int)uVar5;
  prVar3[uVar1].matchLength = uVar4;
  if (minMatch <= uVar4) {
    return;
  }
  if (uVar1 + 1 < uVar2) {
    prVar3[uVar1 + 1].litLength = prVar3[uVar1 + 1].litLength + uVar4;
  }
  rawSeqStore->pos = uVar1 + 1;
  return;
}

Assistant:

void
ZSTD_ldm_skipSequences(rawSeqStore_t* rawSeqStore, size_t srcSize, U32 const minMatch)
{
    while (srcSize > 0 && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq* seq = rawSeqStore->seq + rawSeqStore->pos;
        if (srcSize <= seq->litLength) {
            /* Skip past srcSize literals */
            seq->litLength -= (U32)srcSize;
            return;
        }
        srcSize -= seq->litLength;
        seq->litLength = 0;
        if (srcSize < seq->matchLength) {
            /* Skip past the first srcSize of the match */
            seq->matchLength -= (U32)srcSize;
            if (seq->matchLength < minMatch) {
                /* The match is too short, omit it */
                if (rawSeqStore->pos + 1 < rawSeqStore->size) {
                    seq[1].litLength += seq[0].matchLength;
                }
                rawSeqStore->pos++;
            }
            return;
        }
        srcSize -= seq->matchLength;
        seq->matchLength = 0;
        rawSeqStore->pos++;
    }
}